

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

bool __thiscall Analyser::analyse_function_definition(Analyser *this)

{
  int iVar1;
  ulong uVar2;
  pointer pTVar3;
  char type;
  long *plVar4;
  string *psVar5;
  _Storage *p_Var6;
  bool bVar7;
  string func;
  optional<Token> next;
  _Arg __arg;
  any local_d0;
  _Storage<Token,_false> local_c0;
  char local_a0;
  undefined1 local_98 [32];
  bool local_78;
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  _Arg local_30;
  
  nextToken((optional<Token> *)local_98,this);
  uVar2 = this->_offset;
  bVar7 = (bool)(local_98._0_4_ == RESERVED_WORD & local_78);
  if (bVar7 == false) {
    if (uVar2 != 0) {
      pTVar3 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar2 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 5)) {
        this->_currentLine = (int32_t)pTVar3[uVar2 - 1]._lineNumber;
      }
      this->_offset = uVar2 - 1;
    }
  }
  else {
    if (uVar2 != 0) {
      pTVar3 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar2 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 5)) {
        this->_currentLine = (int32_t)pTVar3[uVar2 - 1]._lineNumber;
      }
      this->_offset = uVar2 - 1;
    }
    type = analyse_type_specifier(this);
    nextToken((optional<Token> *)&local_c0._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_98,
               (_Optional_payload_base<Token> *)&local_c0._M_value);
    if (local_a0 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&local_c0._M_value);
    }
    if ((local_78 != true) || (local_98._0_4_ != IDENTIFIER)) {
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Missing identifier","");
      iVar1 = this->_currentLine;
      *(string **)psVar5 = psVar5 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar5,local_50,local_50 + local_48);
      *(long *)(psVar5 + 0x20) = (long)iVar1;
      __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
    }
    local_d0._M_storage._M_ptr = (void *)0x0;
    if ((_func_void__Op_any_ptr__Arg_ptr *)local_98._8_8_ == (_func_void__Op_any_ptr__Arg_ptr *)0x0)
    {
      local_d0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_30._M_obj = &local_d0;
      (*(code *)local_98._8_8_)(_Op_clone,(any *)(local_98 + 8),&local_30);
    }
    plVar4 = (long *)std::__any_caster<std::__cxx11::string>(&local_d0);
    if (plVar4 == (long *)0x0) {
      std::__throw_bad_any_cast();
    }
    p_Var6 = (_Storage *)(plVar4 + 2);
    if ((_Storage *)*plVar4 == p_Var6) {
      local_c0._M_value._value._M_storage = *p_Var6;
      local_c0._M_value._lineNumber = plVar4[3];
      local_c0._0_8_ = (void *)((long)&local_c0 + 0x10);
    }
    else {
      local_c0._M_value._value._M_storage = *p_Var6;
      local_c0._0_8_ = (_Storage *)*plVar4;
    }
    local_c0._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)plVar4[1];
    *plVar4 = (long)p_Var6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_d0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_d0._M_manager)(_Op_destroy,&local_d0,(_Arg *)0x0);
      local_d0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_c0._0_8_,
               local_c0._M_value._value._M_manager + local_c0._0_8_);
    addFunction(this,&local_70,type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_78 == false) {
      std::__throw_bad_optional_access();
    }
    addConstant(this,(Token *)local_98);
    analyse_parameter_clause(this);
    analyse_compound_statement(this);
    addRet(this);
    if ((void *)local_c0._0_8_ != (void *)((long)&local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,(long)local_c0._M_value._value._M_storage + 1);
    }
  }
  if (local_78 == true) {
    std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_98);
  }
  return bVar7;
}

Assistant:

bool Analyser::analyse_function_definition() {
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
		unreadToken();
		return false;
	}
	unreadToken();
	char type = analyse_type_specifier();
	//<identifier>
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string func = std::any_cast<std::string>(next.value().GetValue());
	addFunction(func, type);
	addConstant(next.value());
	//<parameter - clause>
	analyse_parameter_clause();
	analyse_compound_statement();
	addRet();
	return true;
}